

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

void __thiscall Matrix<double>::reshape(Matrix<double> *this,Shape *shape)

{
  pointer __pos;
  pointer pvVar1;
  uint uVar2;
  vector<double,_std::allocator<double>_> *vec;
  pointer this_00;
  
  __pos = (this->m_elems).
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (__pos != (this->m_elems).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_erase_at_end(&this->m_elems,__pos);
  }
  (this->m_shape).is_diogonal = shape->is_diogonal;
  uVar2 = shape->n_col;
  (this->m_shape).n_row = shape->n_row;
  (this->m_shape).n_col = uVar2;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->m_elems,(ulong)shape->n_row);
  if (shape->n_col != 0) {
    pvVar1 = (this->m_elems).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->m_elems).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1;
        this_00 = this_00 + 1) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(ulong)shape->n_col);
    }
  }
  return;
}

Assistant:

void Matrix<T>::reshape(const Shape& shape){
    if(!m_elems.empty()) m_elems.clear();
    m_shape=shape;

    m_elems.resize(shape.n_row);
    if(shape.n_col){
        for(auto& vec: m_elems)
            vec.resize(shape.n_col);
    }
}